

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O3

SFormat lj_strfmt_parse(FormatState *fs)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  SFormat SVar4;
  MSize MVar5;
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  byte *pbVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  byte *pbVar14;
  
  pbVar1 = fs->p;
  pbVar2 = fs->e;
  fs->str = (char *)pbVar1;
  pbVar14 = pbVar1;
  pbVar10 = pbVar1;
  if (pbVar1 < pbVar2) {
    lVar8 = 0;
    pbVar3 = pbVar1;
    do {
      pbVar6 = pbVar3 + 1;
      if (*pbVar3 == 0x25) {
        bVar9 = *pbVar6;
        uVar12 = (uint)bVar9;
        if (bVar9 == 0x25) {
          pbVar14 = pbVar6;
          pbVar10 = pbVar1 + (2 - lVar8);
        }
        else {
          pbVar14 = pbVar3;
          pbVar10 = pbVar3;
          if (lVar8 == 0) {
            uVar7 = 0;
            if (0x10 < bVar9 - 0x20) goto LAB_00118a22;
            uVar7 = 0;
            uVar12 = (uint)bVar9;
            goto LAB_001189b9;
          }
        }
        break;
      }
      lVar8 = lVar8 + -1;
      pbVar14 = pbVar2;
      pbVar10 = pbVar2;
      pbVar3 = pbVar6;
    } while (pbVar6 != pbVar2);
  }
  fs->p = pbVar10;
  MVar5 = (int)pbVar14 - (int)pbVar1;
  fs->len = MVar5;
  return (uint)(MVar5 != 0) * 2;
LAB_001189b9:
  do {
    if (uVar12 < 0x2b) {
      if (uVar12 == 0x20) {
        uVar11 = 0x800;
      }
      else {
        if (uVar12 != 0x23) break;
        uVar11 = 0x1000;
      }
    }
    else if (uVar12 == 0x30) {
      uVar11 = 0x400;
    }
    else {
      uVar11 = 0x100;
      if (uVar12 != 0x2d) {
        if (uVar12 != 0x2b) break;
        uVar11 = 0x200;
      }
    }
    uVar7 = uVar7 | uVar11;
    pbVar14 = pbVar6 + 1;
    pbVar6 = pbVar6 + 1;
    uVar12 = (uint)*pbVar14;
  } while (*pbVar14 - 0x20 < 0x11);
LAB_00118a22:
  uVar11 = uVar12 - 0x30;
  if (uVar11 < 10) {
    uVar13 = pbVar6[1] - 0x30;
    pbVar14 = pbVar6 + (ulong)(uVar13 < 10) + 1;
    uVar12 = (pbVar6[1] - 0x30) + uVar11 * 10;
    if (9 < uVar13) {
      uVar12 = uVar11;
    }
    pbVar10 = pbVar6 + 1;
    pbVar6 = pbVar6 + 2;
    if (9 < uVar13) {
      pbVar6 = pbVar10;
    }
    uVar7 = uVar7 | uVar12 << 0x10;
    uVar12 = (uint)*pbVar14;
  }
  bVar9 = (byte)uVar12;
  if (bVar9 == 0x2e) {
    bVar9 = pbVar6[1];
    uVar12 = bVar9 - 0x30;
    if (uVar12 < 10) {
      bVar9 = pbVar6[2];
      if (bVar9 - 0x30 < 10) {
        uVar12 = (bVar9 - 0x30) + uVar12 * 10;
        bVar9 = pbVar6[3];
        pbVar6 = pbVar6 + 3;
      }
      else {
        pbVar6 = pbVar6 + 2;
      }
    }
    else {
      pbVar6 = pbVar6 + 1;
      uVar12 = 0;
    }
    uVar7 = uVar7 | uVar12 * 0x1000000 + 0x1000000;
  }
  uVar12 = bVar9 - 0x41;
  if ((uVar12 < 0x38) && ((0x6a3e82ff7fff8eU >> ((ulong)uVar12 & 0x3f) & 1) == 0)) {
    bVar9 = "\x05"[uVar12];
    fs->p = pbVar6 + 1;
    SVar4 = (uint)(uVar12 < 0x20) << 0xd | uVar7 | (uint)bVar9;
  }
  else {
    fs->len = (((int)pbVar6 + 1) - (uint)(bVar9 < 0x20)) - (int)pbVar1;
    fs->p = pbVar2;
    SVar4 = 1;
  }
  return SVar4;
}

Assistant:

SFormat LJ_FASTCALL lj_strfmt_parse(FormatState *fs)
{
  const uint8_t *p = fs->p, *e = fs->e;
  fs->str = (const char *)p;
  for (; p < e; p++) {
    if (*p == '%') {  /* Escape char? */
      if (p[1] == '%') {  /* '%%'? */
	fs->p = ++p+1;
	goto retlit;
      } else {
	SFormat sf = 0;
	uint32_t c;
	if (p != (const uint8_t *)fs->str)
	  break;
	for (p++; (uint32_t)*p - ' ' <= (uint32_t)('0' - ' '); p++) {
	  /* Parse flags. */
	  if (*p == '-') sf |= STRFMT_F_LEFT;
	  else if (*p == '+') sf |= STRFMT_F_PLUS;
	  else if (*p == '0') sf |= STRFMT_F_ZERO;
	  else if (*p == ' ') sf |= STRFMT_F_SPACE;
	  else if (*p == '#') sf |= STRFMT_F_ALT;
	  else break;
	}
	if ((uint32_t)*p - '0' < 10) {  /* Parse width. */
	  uint32_t width = (uint32_t)*p++ - '0';
	  if ((uint32_t)*p - '0' < 10)
	    width = (uint32_t)*p++ - '0' + width*10;
	  sf |= (width << STRFMT_SH_WIDTH);
	}
	if (*p == '.') {  /* Parse precision. */
	  uint32_t prec = 0;
	  p++;
	  if ((uint32_t)*p - '0' < 10) {
	    prec = (uint32_t)*p++ - '0';
	    if ((uint32_t)*p - '0' < 10)
	      prec = (uint32_t)*p++ - '0' + prec*10;
	  }
	  sf |= ((prec+1) << STRFMT_SH_PREC);
	}
	/* Parse conversion. */
	c = (uint32_t)*p - 'A';
	if (LJ_LIKELY(c <= (uint32_t)('x' - 'A'))) {
	  uint32_t sx = strfmt_map[c];
	  if (sx) {
	    fs->p = p+1;
	    return (sf | sx | ((c & 0x20) ? 0 : STRFMT_F_UPPER));
	  }
	}
	/* Return error location. */
	if (*p >= 32) p++;
	fs->len = (MSize)(p - (const uint8_t *)fs->str);
	fs->p = fs->e;
	return STRFMT_ERR;
      }
    }
  }
  fs->p = p;
retlit:
  fs->len = (MSize)(p - (const uint8_t *)fs->str);
  return fs->len ? STRFMT_LIT : STRFMT_EOF;
}